

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageHeader_IncompleteInputBuffer_Test::TestBody
          (CoapTest_CoapMessageHeader_IncompleteInputBuffer_Test *this)

{
  initializer_list<unsigned_char> __l;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_d8;
  Message local_d0;
  ErrorCode local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  void *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  Error error;
  allocator<unsigned_char> local_3a;
  uchar local_39;
  iterator local_38;
  undefined1 local_30 [16];
  ByteArray buffer;
  CoapTest_CoapMessageHeader_IncompleteInputBuffer_Test *this_local;
  
  local_39 = 0xcc;
  local_38 = &local_39;
  local_30._0_8_ = 1;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_3a);
  __l._M_len = local_30._0_8_;
  __l._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_30 + 8),__l,&local_3a);
  std::allocator<unsigned_char>::~allocator(&local_3a);
  Error::Error((Error *)&gtest_ar.message_);
  Message::Deserialize((Message *)local_98,(Error *)&gtest_ar.message_,(ByteArray *)(local_30 + 8));
  local_a0 = (void *)0x0;
  testing::internal::EqHelper::
  Compare<std::shared_ptr<ot::commissioner::coap::Message>,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_88,"Message::Deserialize(error, buffer)","nullptr",
             (shared_ptr<ot::commissioner::coap::Message> *)local_98,&local_a0);
  std::shared_ptr<ot::commissioner::coap::Message>::~shared_ptr
            ((shared_ptr<ot::commissioner::coap::Message> *)local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_c4 = kBadFormat;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_c0,"error","ErrorCode::kBadFormat",(Error *)&gtest_ar.message_,
             &local_c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  Error::~Error((Error *)&gtest_ar.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_30 + 8));
  return;
}

Assistant:

TEST(CoapTest, CoapMessageHeader_IncompleteInputBuffer)
{
    ByteArray buffer{0xcc};
    Error     error;

    EXPECT_EQ(Message::Deserialize(error, buffer), nullptr);
    EXPECT_EQ(error, ErrorCode::kBadFormat);
}